

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_scale_impl(ggml_context *ctx,ggml_tensor *a,float s,_Bool inplace)

{
  _Bool _Var1;
  ggml_tensor *tensor;
  undefined1 in_DL;
  ggml_tensor *in_RSI;
  undefined4 in_XMM0_Da;
  ggml_tensor *result;
  ggml_tensor *in_stack_ffffffffffffffd8;
  ggml_tensor *in_stack_ffffffffffffffe0;
  undefined3 in_stack_ffffffffffffffe8;
  uint uVar2;
  
  uVar2 = CONCAT13(in_DL,in_stack_ffffffffffffffe8) & 0x1ffffff;
  _Var1 = ggml_is_padded_1d(in_stack_ffffffffffffffe0);
  if (!_Var1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml.c"
               ,0xb19,"GGML_ASSERT(%s) failed","ggml_is_padded_1d(a)");
  }
  if ((uVar2 & 0x1000000) == 0) {
    tensor = ggml_dup_tensor((ggml_context *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  }
  else {
    tensor = ggml_view_tensor((ggml_context *)in_RSI,(ggml_tensor *)CONCAT44(in_XMM0_Da,uVar2));
  }
  ggml_set_op_params(tensor,tensor,0x14d2f7);
  tensor->op = GGML_OP_SCALE;
  tensor->src[0] = in_RSI;
  return tensor;
}

Assistant:

static struct ggml_tensor * ggml_scale_impl(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        float                 s,
        bool                  inplace) {
    GGML_ASSERT(ggml_is_padded_1d(a));

    struct ggml_tensor * result = inplace ? ggml_view_tensor(ctx, a) : ggml_dup_tensor(ctx, a);

    ggml_set_op_params(result, &s, sizeof(s));

    result->op     = GGML_OP_SCALE;
    result->src[0] = a;

    return result;
}